

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  ID local_24;
  undefined1 local_1d;
  uint32_t local_1c;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_1d = 0;
  local_1c = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  to_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,local_1c);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_24,DecorationNonUniform);
  if (bVar1) {
    convert_non_uniform_expression(this,__return_storage_ptr__,local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_non_uniform_aware_expression(uint32_t id)
{
	string expr = to_expression(id);

	if (has_decoration(id, DecorationNonUniform))
		convert_non_uniform_expression(expr, id);

	return expr;
}